

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicBoard.cpp
# Opt level: O0

void __thiscall
GraphicBoard::createTiles(GraphicBoard *this,QImage *image,size_t boardSize,size_t tileSize)

{
  reference pvVar1;
  Format local_60 [4];
  QImage local_50 [24];
  uint local_38;
  uint local_34;
  uint xPos;
  uint yPos;
  size_t pictureSize;
  size_t tileSize_local;
  size_t boardSize_local;
  QImage *image_local;
  GraphicBoard *this_local;
  
  _xPos = boardSize * tileSize;
  pictureSize = tileSize;
  tileSize_local = boardSize;
  boardSize_local = (size_t)image;
  image_local = (QImage *)this;
  std::vector<QImage,_std::allocator<QImage>_>::reserve(&this->images,boardSize * boardSize);
  for (local_34 = 0; local_34 < _xPos; local_34 = local_34 + (int)pictureSize) {
    for (local_38 = 0;
        (local_38 < _xPos &&
        (((ulong)local_34 != _xPos - pictureSize || ((ulong)local_38 != _xPos - pictureSize))));
        local_38 = local_38 + (int)pictureSize) {
      QImage::copy(local_50,(EVP_PKEY_CTX *)boardSize_local,(EVP_PKEY_CTX *)(ulong)local_38);
      std::vector<QImage,_std::allocator<QImage>_>::emplace_back<QImage>(&this->images,local_50);
      QImage::~QImage(local_50);
    }
  }
  local_60[0] = Format_RGB32;
  std::vector<QImage,std::allocator<QImage>>::
  emplace_back<unsigned_long&,unsigned_long&,QImage::Format>
            ((vector<QImage,std::allocator<QImage>> *)&this->images,&pictureSize,&pictureSize,
             local_60);
  pvVar1 = std::vector<QImage,_std::allocator<QImage>_>::back(&this->images);
  QImage::fill((GlobalColor)pvVar1);
  Message::putMessage(GRAPHIC_LOAD_OK,tileSize_local);
  return;
}

Assistant:

void GraphicBoard::createTiles( QImage& image, size_t boardSize, size_t tileSize )
{
    size_t pictureSize = boardSize * tileSize;
    images.reserve( boardSize * boardSize );

    for ( uint yPos = 0; yPos < pictureSize; yPos += tileSize )
    {
        for ( uint xPos = 0; xPos < pictureSize; xPos += tileSize )
        {
            if (( yPos == pictureSize - tileSize ) && ( xPos == pictureSize - tileSize ))
            {
                break;
            }
            images.emplace_back( image.copy( xPos, yPos, tileSize, tileSize ));
        }
    }

    images.emplace_back( tileSize, tileSize, QImage::Format_RGB32 );
    images.back().fill( Qt::GlobalColor::white );
    Message::putMessage( Result::GRAPHIC_LOAD_OK, boardSize );
}